

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_Z.c
# Opt level: O0

void test2(void)

{
  archive_entry *paVar1;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  char *name;
  archive *a;
  archive_entry *ae;
  wchar_t in_stack_00000028;
  char *in_stack_000003f0;
  archive *in_stack_ffffffffffffffd8;
  archive_entry *paVar2;
  archive_entry **ppaVar3;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  uint in_stack_ffffffffffffffe4;
  char *_a;
  wchar_t line;
  archive_entry *in_stack_fffffffffffffff8;
  
  _a = "test_read_format_iso_2.iso.Z";
  extract_reference_file(in_stack_000003f0);
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)paVar1,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      (longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar1,(char *)0x17bdf6,name);
  archive_read_support_format_all((archive *)paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar2,(char *)0x17be2f,name);
  archive_read_open_filename
            ((archive *)paVar2,_a,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar2,(char *)0x17be72,name);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      (longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar1,(char *)0x17beb0,name);
  archive_entry_pathname(paVar1);
  ppaVar3 = (archive_entry **)0x0;
  uVar4 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)in_stack_fffffffffffffff8,(char *)paVar2,_a,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),ppaVar3);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                      (longlong)paVar2,(char *)0x17bf35,name);
  archive_entry_pathname(paVar2);
  ppaVar3 = (archive_entry **)0x0;
  uVar4 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)in_stack_fffffffffffffff8,(char *)paVar1,_a,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),ppaVar3);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                      (longlong)paVar1,(char *)0x17bfba,name);
  archive_entry_pathname(paVar1);
  ppaVar3 = (archive_entry **)0x0;
  uVar4 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)in_stack_fffffffffffffff8,(char *)paVar2,_a,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),ppaVar3);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                      (longlong)paVar2,(char *)0x17c03f,name);
  archive_entry_pathname(paVar2);
  ppaVar3 = (archive_entry **)0x0;
  uVar4 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)in_stack_fffffffffffffff8,(char *)paVar1,_a,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),ppaVar3);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                      (longlong)paVar1,(char *)0x17c0c4,name);
  archive_entry_pathname(paVar1);
  ppaVar3 = (archive_entry **)0x0;
  uVar4 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)in_stack_fffffffffffffff8,(char *)paVar2,_a,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),ppaVar3);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                      (longlong)paVar2,(char *)0x17c14a,name);
  archive_file_count((archive *)paVar2);
  n = 0;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),0,
                      (char *)0x17c185,name);
  archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),n);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),0,
                      (char *)0x17c1c3,name);
  archive_format((archive *)paVar2);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),0,
                      (char *)0x17c1ff,name);
  archive_entry_is_encrypted(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),0,
                      (char *)0x17c238,name);
  archive_read_has_encrypted_entries((archive *)_a);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                      (longlong)paVar2,(char *)0x17c274,name);
  archive_read_close((archive *)0x17c27e);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      (longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                      (longlong)paVar2,(char *)0x17c2ad,name);
  line = (wchar_t)((ulong)paVar2 >> 0x20);
  archive_read_free((archive *)0x17c2b7);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,line,(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),0,(char *)0x17c2e5,name);
  return;
}

Assistant:

static void
test2(void)
{
	struct archive_entry *ae;
	struct archive *a;
	const char *name = "test_read_format_iso_2.iso.Z";

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, name, 512));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("A", archive_entry_pathname(ae));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("A/B", archive_entry_pathname(ae));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("C", archive_entry_pathname(ae));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualString("C/D", archive_entry_pathname(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_next_header(a, &ae));
	assertEqualInt(5, archive_file_count(a));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}